

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bucketaccum.hpp
# Opt level: O2

LinTerms * __thiscall
mp::BucketAccum1Type<mp::LinTerms>::ExtractSum
          (LinTerms *__return_storage_ptr__,BucketAccum1Type<mp::LinTerms> *this)

{
  size_ty sVar1;
  size_ty *psVar2;
  ulong i;
  LinTerms local_120;
  LinTerms local_a8;
  
  (__return_storage_ptr__->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
  (__return_storage_ptr__->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
       (ptr)&(__return_storage_ptr__->coefs_).super_small_vector_base<std::allocator<double>,_6U>.
             m_data.m_storage;
  (__return_storage_ptr__->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
  (__return_storage_ptr__->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
  (__return_storage_ptr__->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
       (ptr)&(__return_storage_ptr__->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data
             .m_storage;
  (__return_storage_ptr__->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
  psVar2 = &(this->buckets_)._M_elems[1].coefs_.super_small_vector_base<std::allocator<double>,_6U>.
            m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_size;
  i = 0;
  do {
    if (i == 0x40) {
LAB_0028a260:
      while (i < 0x3f) {
        i = i + 1;
        if (*psVar2 != 0) {
          sVar1 = (__return_storage_ptr__->coefs_).
                  super_small_vector_base<std::allocator<double>,_6U>.m_data.
                  super_small_vector_data_base<double_*,_unsigned_long>.m_size;
          if (sVar1 == 0) {
            ExtractBucket(&local_120,this,i);
          }
          else {
            ExtractBucket(&local_a8,this,i);
            MergeSorted<mp::LinTerms>(&local_120,&local_a8,__return_storage_ptr__);
          }
          LinTerms::operator=(__return_storage_ptr__,&local_120);
          LinTerms::~LinTerms(&local_120);
          if (sVar1 != 0) {
            LinTerms::~LinTerms(&local_a8);
          }
        }
        psVar2 = psVar2 + 0xf;
      }
      return __return_storage_ptr__;
    }
    if (psVar2[-0xf] != 0) {
      ExtractBucket(&local_120,this,i);
      LinTerms::operator=(__return_storage_ptr__,&local_120);
      LinTerms::~LinTerms(&local_120);
      goto LAB_0028a260;
    }
    i = i + 1;
    psVar2 = psVar2 + 0xf;
  } while( true );
}

Assistant:

Body BucketAccum1Type<Body>::ExtractSum() {
  Body result;

  size_t i_bucket = 0;
  for ( ; i_bucket<buckets_.size(); ++i_bucket)
    if (HasBucket(i_bucket)) {
      result = ExtractBucket(i_bucket);
      break;
    }

  while ( ++i_bucket<buckets_.size())
    if (HasBucket(i_bucket)) {
      result
          = result.size()
          ? MergeSorted(ExtractBucket(i_bucket), result)
          : ExtractBucket(i_bucket);
    }

  return result;
}